

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O0

uint8_t * xml_easy_name(xml_node *node)

{
  xml_string *s;
  xml_node *node_local;
  
  if (node == (xml_node *)0x0) {
    node_local = (xml_node *)0x0;
  }
  else {
    s = xml_node_name(node);
    node_local = (xml_node *)xml_string_clone(s);
  }
  return (uint8_t *)node_local;
}

Assistant:

uint8_t* xml_easy_name(struct xml_node* node) {
	if (!node) {
		return 0;
	}

	return xml_string_clone(xml_node_name(node));
}